

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<kj::HttpHeaders::Header>::~ArrayBuilder
          (ArrayBuilder<kj::HttpHeaders::Header> *this)

{
  Header *pHVar1;
  RemoveConst<kj::HttpHeaders::Header> *pRVar2;
  Header *pHVar3;
  
  pHVar1 = this->ptr;
  if (pHVar1 != (Header *)0x0) {
    pRVar2 = this->pos;
    pHVar3 = this->endPtr;
    this->ptr = (Header *)0x0;
    this->pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    this->endPtr = (Header *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pHVar1,0x20,(long)pRVar2 - (long)pHVar1 >> 5,
               (long)pHVar3 - (long)pHVar1 >> 5,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }